

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
                    *j)

{
  streamsize sVar1;
  streamsize sVar2;
  uint local_30;
  streamsize indentation;
  bool pretty_print;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *j_local;
  ostream *o_local;
  
  sVar1 = std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)));
  if (0 < sVar1) {
    sVar2 = std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)));
    local_30 = (uint)sVar2;
  }
  else {
    local_30 = 0;
  }
  std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)),0);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  ::dump(j,o,0 < sVar1,local_30,0);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const basic_json& j)
        {
            // read width member and use it as indentation parameter if nonzero
            const bool pretty_print = (o.width() > 0);
            const auto indentation = (pretty_print ? o.width() : 0);

            // reset width to 0 for subsequent calls to this stream
            o.width(0);

            // do the actual serialization
            j.dump(o, pretty_print, static_cast<unsigned int>(indentation));
            return o;
        }